

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

void __thiscall
ddd::DaTrie<true,_false,_true>::insert_prefix_leaf(DaTrie<true,_false,_true> *this,Query *query)

{
  if ((~*(uint *)((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                  super__Vector_impl_data._M_start + query->node_pos_) & 0x7fffffff) == 0) {
    append_edge_(this,query);
  }
  else {
    insert_edge_(this,query);
  }
  *(uint32_t *)
   ((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
    super__Vector_impl_data._M_start + query->node_pos_) = query->value_ | 0x80000000;
  return;
}

Assistant:

void insert_prefix_leaf(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(Prefix);

    if (bc_[query.node_pos()].base() != INVALID_VALUE) {
      insert_edge_(query);
    } else {
      append_edge_(query);
    }
    bc_[query.node_pos()].set_value(query.value());
  }